

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O2

future<dap::ResponseOrError<dap::SetBreakpointsResponse>_> __thiscall
dap::Session::send<dap::SetBreakpointsRequest,void>(Session *this,SetBreakpointsRequest *request)

{
  char cVar1;
  TypeInfo *pTVar2;
  TypeInfo *pTVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<dap::ResponseOrError<dap::SetBreakpointsResponse>_> fVar4;
  promise<dap::ResponseOrError<dap::SetBreakpointsResponse>_> promise;
  __shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_98;
  Error local_88;
  ResponseOrError<dap::SetBreakpointsResponse> local_68;
  
  std::make_shared<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>>>();
  pTVar2 = TypeOf<dap::SetBreakpointsRequest>::type();
  pTVar3 = TypeOf<dap::SetBreakpointsResponse>::type();
  std::
  __shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&local_88,&_Stack_98);
  std::function<void(void_const*,dap::Error_const*)>::
  function<dap::Session::send<dap::SetBreakpointsRequest,void>(dap::SetBreakpointsRequest_const&)::_lambda(void_const*,dap::Error_const*)_1_,void>
            ((function<void(void_const*,dap::Error_const*)> *)&local_68,
             (anon_class_16_1_70ebebfb *)&local_88);
  cVar1 = (**(code **)((long)&((request->breakpoints).val.
                               super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start)->hitCondition + 0x18))
                    (request,pTVar2,pTVar3);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.message._M_string_length);
  if (cVar1 == '\0') {
    Error::Error(&local_88,"Failed to send request");
    ResponseOrError<dap::SetBreakpointsResponse>::ResponseOrError(&local_68,&local_88);
    promise<dap::ResponseOrError<dap::SetBreakpointsResponse>_>::set_value
              ((promise<dap::ResponseOrError<dap::SetBreakpointsResponse>_> *)&_Stack_98,&local_68);
    ResponseOrError<dap::SetBreakpointsResponse>::~ResponseOrError(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::
  __shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)this,&_Stack_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98._M_refcount);
  fVar4.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  fVar4.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (future<dap::ResponseOrError<dap::SetBreakpointsResponse>_>)
         fVar4.state.
         super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

future<ResponseOrError<typename T::Response>> Session::send(const T& request) {
  using Response = typename T::Response;
  promise<ResponseOrError<Response>> promise;
  auto sent = send(TypeOf<T>::type(), TypeOf<Response>::type(), &request,
                   [=](const void* result, const Error* error) {
                     if (error != nullptr) {
                       promise.set_value(ResponseOrError<Response>(*error));
                     } else {
                       promise.set_value(ResponseOrError<Response>(
                           *reinterpret_cast<const Response*>(result)));
                     }
                   });
  if (!sent) {
    promise.set_value(Error("Failed to send request"));
  }
  return promise.get_future();
}